

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.cpp
# Opt level: O0

double Metric(ANNpoint x1,ANNpoint x2,int dim,int *topology,ANNpoint scale)

{
  long in_RCX;
  int in_EDX;
  long in_RSI;
  long in_RDI;
  long in_R8;
  double dVar1;
  double dVar2;
  double norm2;
  double norm1;
  int i;
  double dtheta;
  double fd;
  double rho;
  double local_78;
  double local_60;
  int local_44;
  double local_38;
  double local_30;
  
  local_30 = 0.0;
  for (local_44 = 0; local_44 < in_EDX; local_44 = local_44 + 1) {
    if (*(int *)(in_RCX + (long)local_44 * 4) == 1) {
      local_30 = *(double *)(in_R8 + (long)local_44 * 8) *
                 (*(double *)(in_RDI + (long)local_44 * 8) -
                 *(double *)(in_RSI + (long)local_44 * 8)) *
                 *(double *)(in_R8 + (long)local_44 * 8) *
                 (*(double *)(in_RDI + (long)local_44 * 8) -
                 *(double *)(in_RSI + (long)local_44 * 8)) + local_30;
    }
    else if (*(int *)(in_RCX + (long)local_44 * 4) == 2) {
      local_60 = ABS(*(double *)(in_RDI + (long)local_44 * 8) -
                     *(double *)(in_RSI + (long)local_44 * 8));
      if (6.283185307179586 - local_60 < local_60) {
        local_60 = 6.283185307179586 - local_60;
      }
      local_30 = *(double *)(in_R8 + (long)local_44 * 8) * local_60 *
                 *(double *)(in_R8 + (long)local_44 * 8) * local_60 + local_30;
    }
    else if (*(int *)(in_RCX + (long)local_44 * 4) == 3) {
      local_38 = *(double *)(in_RDI + (long)(local_44 + 3) * 8) *
                 *(double *)(in_RSI + (long)(local_44 + 3) * 8) +
                 *(double *)(in_RDI + (long)(local_44 + 2) * 8) *
                 *(double *)(in_RSI + (long)(local_44 + 2) * 8) +
                 *(double *)(in_RDI + (long)local_44 * 8) * *(double *)(in_RSI + (long)local_44 * 8)
                 + *(double *)(in_RDI + (long)(local_44 + 1) * 8) *
                   *(double *)(in_RSI + (long)(local_44 + 1) * 8);
      if (1.0 < local_38) {
        dVar1 = sqrt((*(double *)(in_RDI + (long)(local_44 + 3) * 8) *
                      *(double *)(in_RDI + (long)(local_44 + 3) * 8) +
                     *(double *)(in_RDI + (long)(local_44 + 2) * 8) *
                     *(double *)(in_RDI + (long)(local_44 + 2) * 8) +
                     *(double *)(in_RDI + (long)local_44 * 8) *
                     *(double *)(in_RDI + (long)local_44 * 8) +
                     *(double *)(in_RDI + (long)(local_44 + 1) * 8) *
                     *(double *)(in_RDI + (long)(local_44 + 1) * 8)) *
                     (*(double *)(in_RSI + (long)(local_44 + 3) * 8) *
                      *(double *)(in_RSI + (long)(local_44 + 3) * 8) +
                     *(double *)(in_RSI + (long)(local_44 + 2) * 8) *
                     *(double *)(in_RSI + (long)(local_44 + 2) * 8) +
                     *(double *)(in_RSI + (long)local_44 * 8) *
                     *(double *)(in_RSI + (long)local_44 * 8) +
                     *(double *)(in_RSI + (long)(local_44 + 1) * 8) *
                     *(double *)(in_RSI + (long)(local_44 + 1) * 8)));
        local_38 = local_38 / dVar1;
      }
      dVar1 = acos(local_38);
      dVar2 = acos(-local_38);
      if (dVar1 <= dVar2) {
        local_78 = acos(local_38);
      }
      else {
        local_78 = acos(-local_38);
      }
      local_30 = *(double *)(in_R8 + (long)local_44 * 8) * local_78 *
                 *(double *)(in_R8 + (long)local_44 * 8) * local_78 + local_30;
      local_44 = local_44 + 3;
    }
  }
  dVar1 = sqrt(local_30);
  return dVar1;
}

Assistant:

double Metric(const ANNpoint x1, const ANNpoint x2, int dim, int *topology,
              ANNpoint scale) {
    double rho = 0, fd, dtheta;

    for (int i = 0; i < dim; i++) {
        if (topology[i] == 1) {
            rho += ANN_POW(scale[i] * (x1[i] - x2[i]));
        } else if (topology[i] == 2) {
            fd = fabs(x1[i] - x2[i]);
            dtheta = ANN_MIN(fd, 2.0 * PI - fd);
            rho += ANN_POW(scale[i] * dtheta);
        } else if (topology[i] == 3) {
            // dot product
            fd = x1[i] * x2[i] + x1[i + 1] * x2[i + 1] + x1[i + 2] * x2[i + 2] +
                 x1[i + 3] * x2[i + 3];
            // Handle non-unit quaternions only if they're larger than 1 (why?)
            // should this be >0 to avoid divide by zero?
            if (fd > 1) {
                double norm1 = x1[i] * x1[i] + x1[i + 1] * x1[i + 1] +
                               x1[i + 2] * x1[i + 2] + x1[i + 3] * x1[i + 3];
                double norm2 = x2[i] * x2[i] + x2[i + 1] * x2[i + 1] +
                               x2[i + 2] * x2[i + 2] + x2[i + 3] * x2[i + 3];
                fd = fd / (sqrt(norm1 * norm2));
            }
            dtheta = ANN_MIN(acos(fd), acos(-fd)); // Quaterion angle in radians
            rho += ANN_POW(scale[i] * dtheta); // squared scaled angle
            i = i + 3;
        }
    }
    // cout << "dist = " << sqrt(rho) << endl <<endl;

    return sqrt(rho);
}